

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

string * __thiscall Log::GetSystemTime_abi_cxx11_(string *__return_storage_ptr__,Log *this)

{
  tm *ptVar1;
  allocator local_221;
  time_t now;
  char content [512];
  
  now = time((time_t *)0x0);
  ptVar1 = localtime(&now);
  memset(content,0,0x200);
  sprintf(content,"[%04d-%02d-%02d %02d:%02d:%02d]",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          (ulong)(uint)ptVar1->tm_min,(ulong)(uint)ptVar1->tm_sec);
  std::__cxx11::string::string((string *)__return_storage_ptr__,content,&local_221);
  return __return_storage_ptr__;
}

Assistant:

string Log::GetSystemTime()
{
    time_t now = time(NULL);
    struct tm* tmstr = localtime(&now);
    char content[512] = { 0 };
    sprintf(content, "[%04d-%02d-%02d %02d:%02d:%02d]",
    tmstr->tm_year + 1900,
    tmstr->tm_mon + 1,
    tmstr->tm_mday,
    tmstr->tm_hour,
    tmstr->tm_min,
    tmstr->tm_sec);
    return string(content);
}